

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicString.h
# Opt level: O1

ulint __thiscall
bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::rank
          (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this,symbol x,
          ulint i)

{
  pointer pvVar1;
  ulong uVar2;
  ulong uVar3;
  vector<bool,_std::allocator<bool>_> code;
  vector<bool,_std::allocator<bool>_> local_40;
  
  if (this->n == 0) {
    i = 0;
  }
  else if (this->unary_string == false) {
    uVar3 = (ulong)x;
    pvVar1 = (this->codes).
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = ((long)(this->codes).
                   super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
            -0x3333333333333333;
    if (uVar2 < uVar3 || uVar2 - uVar3 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    std::vector<bool,_std::allocator<bool>_>::vector(&local_40,pvVar1 + uVar3);
    i = rank(this,&local_40,0,0,i);
    if (local_40.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_40.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
  }
  return i;
}

Assistant:

ulint rank(symbol x, ulint i){

		if(n==0)
			return 0;

	#ifdef DEBUG
		if(i>current_size){

			cout << "ERROR (DynamicString): trying to compute rank in position outside current string : " << i << ">" << current_size << endl;
			exit(0);

		}
	#endif

		if(unary_string)
			return i;

		vector<bool> code = codes.at(x);//bitvector to be searched in the wavelet tree
		return rank(&code, 0, 0, i);

	}